

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm_v_wasm.cpp
# Opt level: O1

string * __thiscall
wasm::getSig_abi_cxx11_(string *__return_storage_ptr__,wasm *this,Type results,Type params)

{
  Type *pTVar1;
  Type *pTVar2;
  Type local_40;
  Type params_local;
  Iterator __begin1;
  
  local_40.id = results.id;
  if (((ulong)this & 1) != 0 && (wasm *)0x6 < this) {
    __assert_fail("!results.isTuple()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/asmjs/asm_v_wasm.cpp"
                  ,0x46,"std::string wasm::getSig(Type, Type)");
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  getSig((Type)this);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  params_local.id = (uintptr_t)&local_40;
  pTVar1 = (Type *)Type::size(&local_40);
  if (pTVar1 == (Type *)0x0) goto LAB_00767cf2;
  do {
    do {
      pTVar2 = Type::Iterator::operator*((Iterator *)&params_local);
      getSig((Type)pTVar2->id);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)((long)&(__begin1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                           parent)->id + 1);
    } while (__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
             pTVar1);
LAB_00767cf2:
  } while ((Type *)params_local.id != &local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string getSig(Type results, Type params) {
  assert(!results.isTuple());
  std::string sig;
  sig += getSig(results);
  for (const auto& param : params) {
    sig += getSig(param);
  }
  return sig;
}